

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O1

void Nwk_ObjPatchFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFaninOld,Nwk_Obj_t *pFaninNew)

{
  int iVar1;
  Nwk_Obj_t *pNVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  if (pFaninOld == pFaninNew) {
    __assert_fail("pFaninOld != pFaninNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFanio.c"
                  ,0xea,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj == pFaninOld) {
    __assert_fail("pObj != pFaninOld",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFanio.c"
                  ,0xeb,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj == pFaninNew) {
    __assert_fail("pObj != pFaninNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFanio.c"
                  ,0xec,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj->pMan != pFaninOld->pMan) {
    __assert_fail("pObj->pMan == pFaninOld->pMan",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFanio.c"
                  ,0xed,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj->pMan != pFaninNew->pMan) {
    __assert_fail("pObj->pMan == pFaninNew->pMan",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFanio.c"
                  ,0xee,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  iVar3 = -1;
  if (0 < (long)pObj->nFanins) {
    lVar5 = 0;
    do {
      if (pObj->pFanio[lVar5] == (Nwk_Obj_t *)0x0) break;
      if (pObj->pFanio[lVar5] == pFaninOld) {
        iVar3 = (int)lVar5;
        break;
      }
      lVar5 = lVar5 + 1;
    } while (pObj->nFanins != lVar5);
  }
  if (iVar3 == -1) {
    printf("Nwk_ObjPatchFanin(); Error! Node %d is not among",(ulong)(uint)pFaninOld->Id);
    printf(" the fanins of node %d...\n",(ulong)(uint)pObj->Id);
    return;
  }
  pObj->pFanio[iVar3] = pFaninNew;
  iVar3 = pFaninOld->nFanouts;
  if (0 < iVar3) {
    iVar4 = pFaninOld->nFanins;
    iVar1 = iVar3 + iVar4;
    lVar5 = (long)iVar4;
    do {
      pNVar2 = pFaninOld->pFanio[lVar5];
      if (pNVar2 != pObj) {
        lVar6 = (long)iVar4;
        iVar4 = iVar4 + 1;
        pFaninOld->pFanio[lVar6] = pNVar2;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar1);
  }
  pFaninOld->nFanouts = iVar3 + -1;
  if (pFaninNew->nFanouts + pFaninNew->nFanins == pFaninNew->nFanioAlloc) {
    Nwk_ManReallocNode(pFaninNew);
  }
  iVar3 = pFaninNew->nFanouts;
  pFaninNew->nFanouts = iVar3 + 1;
  pFaninNew->pFanio[(long)pFaninNew->nFanins + (long)iVar3] = pObj;
  return;
}

Assistant:

void Nwk_ObjPatchFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFaninOld, Nwk_Obj_t * pFaninNew )
{
    int i, k, iFanin, Limit;
    assert( pFaninOld != pFaninNew );
    assert( pObj != pFaninOld );
    assert( pObj != pFaninNew );
    assert( pObj->pMan == pFaninOld->pMan );
    assert( pObj->pMan == pFaninNew->pMan );
    // update the fanin
    iFanin = Nwk_ObjFindFanin( pObj, pFaninOld );
    if ( iFanin == -1 )
    {
        printf( "Nwk_ObjPatchFanin(); Error! Node %d is not among", pFaninOld->Id );
        printf( " the fanins of node %d...\n", pObj->Id );
        return;
    }
    pObj->pFanio[iFanin] = pFaninNew;
    // remove pObj from the fanout list of pFaninOld
    Limit = pFaninOld->nFanins + pFaninOld->nFanouts;
    for ( k = i = pFaninOld->nFanins; i < Limit; i++ )
        if ( pFaninOld->pFanio[i] != pObj )
            pFaninOld->pFanio[k++] = pFaninOld->pFanio[i];
    pFaninOld->nFanouts--;
    // add pObj to the fanout list of pFaninNew
    if ( Nwk_ObjReallocIsNeeded(pFaninNew) )
        Nwk_ManReallocNode( pFaninNew );
    pFaninNew->pFanio[pFaninNew->nFanins + pFaninNew->nFanouts++] = pObj;
}